

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack4to8.h
# Opt level: O0

void ncnn::deconvolution_pack4to8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long *plVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  int iVar72;
  int iVar73;
  undefined8 *puVar74;
  long lVar75;
  long lVar76;
  long lVar77;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_4;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_3;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  ulong uStack_5238;
  int local_4fb0;
  int local_4fa4;
  int local_4f54;
  long local_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  int local_4ecc;
  int local_4ec8;
  undefined1 (*local_4e58) [32];
  int local_4e4c;
  undefined1 local_4800 [8];
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  ulong uStack_4778;
  float local_4720;
  float fStack_471c;
  float fStack_4718;
  float fStack_4714;
  float fStack_4710;
  float fStack_470c;
  float fStack_4708;
  float fStack_4704;
  float local_4620;
  float fStack_461c;
  float fStack_4618;
  float fStack_4614;
  float fStack_4610;
  float fStack_460c;
  float fStack_4608;
  float local_45e0;
  float fStack_45dc;
  float fStack_45d8;
  float fStack_45d4;
  float fStack_45d0;
  float fStack_45cc;
  float fStack_45c8;
  float local_45a0;
  float fStack_459c;
  float fStack_4598;
  float fStack_4594;
  float fStack_4590;
  float fStack_458c;
  float fStack_4588;
  float local_4560;
  float fStack_455c;
  float fStack_4558;
  float fStack_4554;
  float fStack_4550;
  float fStack_454c;
  float fStack_4548;
  float local_43c0;
  float fStack_43bc;
  float fStack_43b8;
  float fStack_43b4;
  float fStack_43b0;
  float fStack_43ac;
  float fStack_43a8;
  float fStack_43a4;
  float local_43a0;
  float fStack_439c;
  float fStack_4398;
  float fStack_4394;
  float fStack_4390;
  float fStack_438c;
  float fStack_4388;
  float local_4380;
  float fStack_437c;
  float fStack_4378;
  float fStack_4374;
  float fStack_4370;
  float fStack_436c;
  float fStack_4368;
  float fStack_4364;
  ulong uStack_4238;
  float local_4200;
  float fStack_41fc;
  float fStack_41f8;
  float fStack_41f4;
  float fStack_41f0;
  float fStack_41ec;
  float fStack_41e8;
  float fStack_41e4;
  float local_41a0;
  float fStack_419c;
  float fStack_4198;
  float fStack_4194;
  float fStack_4190;
  float fStack_418c;
  float fStack_4188;
  float fStack_4184;
  float local_4160;
  float fStack_415c;
  float fStack_4158;
  float fStack_4154;
  float fStack_4150;
  float fStack_414c;
  float fStack_4148;
  float local_4140;
  float fStack_413c;
  float fStack_4138;
  float fStack_4134;
  float fStack_4130;
  float fStack_412c;
  float fStack_4128;
  undefined4 uStack_4124;
  undefined1 local_40e0 [8];
  float fStack_40d8;
  float fStack_40d4;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  float local_4000;
  float fStack_3ffc;
  float fStack_3ff8;
  float fStack_3ff4;
  float fStack_3ff0;
  float fStack_3fec;
  float fStack_3fe8;
  float fStack_3fe4;
  float local_3fc0;
  float fStack_3fbc;
  float fStack_3fb8;
  float fStack_3fb4;
  float fStack_3fb0;
  float fStack_3fac;
  float fStack_3fa8;
  float fStack_3fa4;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  undefined4 uStack_3f44;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined1 local_3bc0 [8];
  float fStack_3bb8;
  float fStack_3bb4;
  float fStack_3bb0;
  float fStack_3bac;
  float fStack_3ba8;
  undefined4 uStack_3ba4;
  undefined1 local_3b80 [16];
  float local_3680;
  float fStack_367c;
  float fStack_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float fStack_3668;
  float local_34e0;
  float fStack_34dc;
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float local_3480;
  float fStack_347c;
  float fStack_3478;
  float fStack_3474;
  float fStack_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined1 local_3340 [8];
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  undefined4 uStack_3324;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  float fStack_2df0;
  float fStack_2dec;
  float fStack_2de8;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_2120;
  float fStack_211c;
  float fStack_2118;
  float fStack_2114;
  float fStack_2110;
  float fStack_210c;
  float fStack_2108;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  undefined4 uStack_20c4;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  undefined4 uStack_1e24;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_10a0 [8];
  float fStack_1098;
  float fStack_1094;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1020 [8];
  float fStack_1018;
  float fStack_1014;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined8 local_140;
  undefined8 uStack_138;
  
  lVar68 = in_RSI[7];
  lVar9 = *in_RCX;
  for (local_4e4c = 0; local_4e4c < (int)lVar68; local_4e4c = local_4e4c + 1) {
    local_4e58 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_4e4c * in_RSI[2]);
    iVar7 = *(int *)((long)in_RDI + 0x2c);
    lVar69 = in_RDI[6];
    lVar70 = in_RDI[7];
    iVar8 = *(int *)((long)in_RSI + 0x2c);
    lVar71 = in_RSI[6];
    for (local_4ec8 = 0; local_4ec8 < (int)lVar71; local_4ec8 = local_4ec8 + 1) {
      for (local_4ecc = 0; local_4ecc < iVar8; local_4ecc = local_4ecc + 1) {
        local_4f00 = 0;
        uStack_4ef8 = 0;
        uStack_4ef0 = 0;
        uStack_4ee8 = 0;
        if (lVar9 != 0) {
          puVar74 = (undefined8 *)(lVar9 + (long)(local_4e4c << 3) * 4);
          local_4f00 = *puVar74;
          uStack_4ef8 = puVar74[1];
          uStack_4ef0 = puVar74[2];
          uStack_4ee8 = puVar74[3];
        }
        local_4f08 = *in_RDX + in_RDX[8] * (long)local_4e4c * in_RDX[2];
        for (local_4f54 = 0; local_4f54 < (int)lVar70; local_4f54 = local_4f54 + 1) {
          for (local_4fa4 = 0; local_4fa4 < in_R9D; local_4fa4 = local_4fa4 + 1) {
            iVar72 = (local_4ec8 + local_4fa4 * dilation_w) - dilation_w * (in_R9D + -1);
            if (((-1 < iVar72) && (iVar72 % stride_w == 0)) && (iVar72 / stride_w < (int)lVar69)) {
              for (local_4fb0 = 0; local_4fb0 < in_R8D; local_4fb0 = local_4fb0 + 1) {
                iVar73 = (local_4ecc + local_4fb0 * in_stack_00000008) -
                         in_stack_00000008 * (in_R8D + -1);
                if (((-1 < iVar73) && (iVar73 % dilation_h == 0)) && (iVar73 / dilation_h < iVar7))
                {
                  pfVar1 = (float *)(*in_RDI + in_RDI[8] * (long)local_4f54 * in_RDI[2] +
                                     (long)*(int *)((long)in_RDI + 0x2c) * (long)(iVar72 / stride_w)
                                     * in_RDI[2] + (long)(iVar73 / dilation_h << 2) * 4);
                  iVar73 = (local_4fa4 * in_R8D + local_4fb0) * 0x20;
                  fVar2 = *pfVar1;
                  fVar3 = pfVar1[1];
                  fVar4 = pfVar1[2];
                  fVar5 = pfVar1[3];
                  puVar74 = (undefined8 *)(local_4f08 + (long)iVar73 * 4);
                  lVar75 = local_4f08 + (long)iVar73 * 4;
                  lVar76 = local_4f08 + (long)iVar73 * 4;
                  lVar77 = local_4f08 + (long)iVar73 * 4;
                  local_4620 = (float)*puVar74;
                  fStack_461c = (float)((ulong)*puVar74 >> 0x20);
                  fStack_4618 = (float)puVar74[1];
                  fStack_4614 = (float)((ulong)puVar74[1] >> 0x20);
                  fStack_4610 = (float)puVar74[2];
                  fStack_460c = (float)((ulong)puVar74[2] >> 0x20);
                  fStack_4608 = (float)puVar74[3];
                  local_4720 = (float)local_4f00;
                  fStack_471c = (float)((ulong)local_4f00 >> 0x20);
                  fStack_4718 = (float)uStack_4ef8;
                  fStack_4714 = (float)((ulong)uStack_4ef8 >> 0x20);
                  fStack_4710 = (float)uStack_4ef0;
                  fStack_470c = (float)((ulong)uStack_4ef0 >> 0x20);
                  fStack_4708 = (float)uStack_4ee8;
                  fStack_4704 = (float)((ulong)uStack_4ee8 >> 0x20);
                  local_45e0 = (float)*(undefined8 *)(lVar75 + 0x20);
                  fStack_45dc = (float)((ulong)*(undefined8 *)(lVar75 + 0x20) >> 0x20);
                  fStack_45d8 = (float)*(undefined8 *)(lVar75 + 0x28);
                  fStack_45d4 = (float)((ulong)*(undefined8 *)(lVar75 + 0x28) >> 0x20);
                  fStack_45d0 = (float)*(undefined8 *)(lVar75 + 0x30);
                  fStack_45cc = (float)((ulong)*(undefined8 *)(lVar75 + 0x30) >> 0x20);
                  fStack_45c8 = (float)*(undefined8 *)(lVar75 + 0x38);
                  local_45a0 = (float)*(undefined8 *)(lVar76 + 0x40);
                  fStack_459c = (float)((ulong)*(undefined8 *)(lVar76 + 0x40) >> 0x20);
                  fStack_4598 = (float)*(undefined8 *)(lVar76 + 0x48);
                  fStack_4594 = (float)((ulong)*(undefined8 *)(lVar76 + 0x48) >> 0x20);
                  fStack_4590 = (float)*(undefined8 *)(lVar76 + 0x50);
                  fStack_458c = (float)((ulong)*(undefined8 *)(lVar76 + 0x50) >> 0x20);
                  fStack_4588 = (float)*(undefined8 *)(lVar76 + 0x58);
                  local_4560 = (float)*(undefined8 *)(lVar77 + 0x60);
                  fStack_455c = (float)((ulong)*(undefined8 *)(lVar77 + 0x60) >> 0x20);
                  fStack_4558 = (float)*(undefined8 *)(lVar77 + 0x68);
                  fStack_4554 = (float)((ulong)*(undefined8 *)(lVar77 + 0x68) >> 0x20);
                  fStack_4550 = (float)*(undefined8 *)(lVar77 + 0x70);
                  fStack_454c = (float)((ulong)*(undefined8 *)(lVar77 + 0x70) >> 0x20);
                  fStack_4548 = (float)*(undefined8 *)(lVar77 + 0x78);
                  local_4f00 = CONCAT44(fVar5 * fStack_455c +
                                        fVar4 * fStack_459c +
                                        fVar3 * fStack_45dc + fVar2 * fStack_461c + fStack_471c,
                                        fVar5 * local_4560 +
                                        fVar4 * local_45a0 +
                                        fVar3 * local_45e0 + fVar2 * local_4620 + local_4720);
                  uStack_4ef8 = CONCAT44(fVar5 * fStack_4554 +
                                         fVar4 * fStack_4594 +
                                         fVar3 * fStack_45d4 + fVar2 * fStack_4614 + fStack_4714,
                                         fVar5 * fStack_4558 +
                                         fVar4 * fStack_4598 +
                                         fVar3 * fStack_45d8 + fVar2 * fStack_4618 + fStack_4718);
                  uStack_4ef0 = CONCAT44(fVar5 * fStack_454c +
                                         fVar4 * fStack_458c +
                                         fVar3 * fStack_45cc + fVar2 * fStack_460c + fStack_470c,
                                         fVar5 * fStack_4550 +
                                         fVar4 * fStack_4590 +
                                         fVar3 * fStack_45d0 + fVar2 * fStack_4610 + fStack_4710);
                  uStack_4ee8 = CONCAT44(fVar5 + fVar4 + fVar3 + fVar2 + fStack_4704,
                                         fVar5 * fStack_4548 +
                                         fVar4 * fStack_4588 +
                                         fVar3 * fStack_45c8 + fVar2 * fStack_4608 + fStack_4708);
                }
              }
            }
          }
          local_4f08 = local_4f08 + (long)(in_R8D * in_R9D * 0x20) * 4;
        }
        plVar20 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_4140 = (float)local_4f00;
        fStack_413c = (float)((ulong)local_4f00 >> 0x20);
        fStack_4138 = (float)uStack_4ef8;
        fStack_4134 = (float)((ulong)uStack_4ef8 >> 0x20);
        fStack_4130 = (float)uStack_4ef0;
        fStack_412c = (float)((ulong)uStack_4ef0 >> 0x20);
        fStack_4128 = (float)uStack_4ee8;
        switch(stride_h) {
        case 1:
          uStack_4778 = SUB328(ZEXT832(0),4);
          auVar21._8_8_ = uStack_4ef8;
          auVar21._0_8_ = local_4f00;
          auVar21._16_8_ = uStack_4ef0;
          auVar21._24_8_ = uStack_4ee8;
          _local_4800 = vmaxps_avx(auVar21,ZEXT832(uStack_4778) << 0x40);
          break;
        case 2:
          uVar6 = *(uint *)*plVar20;
          auVar24._8_8_ = uStack_4ef8;
          auVar24._0_8_ = local_4f00;
          auVar24._16_8_ = uStack_4ef0;
          auVar24._24_8_ = uStack_4ee8;
          auVar17 = vmaxps_avx(ZEXT832(0),auVar24);
          auVar25._8_8_ = uStack_4ef8;
          auVar25._0_8_ = local_4f00;
          auVar25._16_8_ = uStack_4ef0;
          auVar25._24_8_ = uStack_4ee8;
          auVar16 = vminps_avx(ZEXT832(0),auVar25);
          auVar10 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar6),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar6),0x30);
          auVar11 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x30);
          local_4380 = auVar11._0_4_;
          fStack_437c = auVar11._4_4_;
          fStack_4378 = auVar11._8_4_;
          fStack_4374 = auVar11._12_4_;
          fStack_4370 = auVar10._0_4_;
          fStack_436c = auVar10._4_4_;
          fStack_4368 = auVar10._8_4_;
          fStack_4364 = auVar10._12_4_;
          local_43a0 = auVar16._0_4_;
          fStack_439c = auVar16._4_4_;
          fStack_4398 = auVar16._8_4_;
          fStack_4394 = auVar16._12_4_;
          fStack_4390 = auVar16._16_4_;
          fStack_438c = auVar16._20_4_;
          fStack_4388 = auVar16._24_4_;
          local_43c0 = auVar17._0_4_;
          fStack_43bc = auVar17._4_4_;
          fStack_43b8 = auVar17._8_4_;
          fStack_43b4 = auVar17._12_4_;
          fStack_43b0 = auVar17._16_4_;
          fStack_43ac = auVar17._20_4_;
          fStack_43a8 = auVar17._24_4_;
          fStack_43a4 = auVar17._28_4_;
          local_4800._4_4_ = fStack_43bc + fStack_437c * fStack_439c;
          local_4800._0_4_ = local_43c0 + local_4380 * local_43a0;
          uStack_47f8._0_4_ = fStack_43b8 + fStack_4378 * fStack_4398;
          uStack_47f8._4_4_ = fStack_43b4 + fStack_4374 * fStack_4394;
          uStack_47f0._0_4_ = fStack_43b0 + fStack_4370 * fStack_4390;
          uStack_47f0._4_4_ = fStack_43ac + fStack_436c * fStack_438c;
          uStack_47e8._0_4_ = fStack_43a8 + fStack_4368 * fStack_4388;
          uStack_47e8._4_4_ = fStack_43a4 + fStack_4364;
          break;
        case 3:
          uVar6 = *(uint *)*plVar20;
          auVar10 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar6),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar6),0x30);
          auVar11 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x30);
          uStack_3d50 = auVar11._0_8_;
          uStack_3d48 = auVar11._8_8_;
          uVar6 = *(uint *)(*plVar20 + 4);
          auVar11 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x30);
          auVar12 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar6),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar6),0x30);
          uStack_3d10 = auVar11._0_8_;
          uStack_3d08 = auVar11._8_8_;
          auVar23._8_8_ = uStack_4ef8;
          auVar23._0_8_ = local_4f00;
          auVar23._16_8_ = uStack_4ef0;
          auVar23._24_8_ = uStack_4ee8;
          auVar22._16_8_ = uStack_3d50;
          auVar22._0_16_ = auVar10;
          auVar22._24_8_ = uStack_3d48;
          auVar17 = vmaxps_avx(auVar23,auVar22);
          auVar26._16_8_ = uStack_3d10;
          auVar26._0_16_ = auVar12;
          auVar26._24_8_ = uStack_3d08;
          _local_4800 = vminps_avx(auVar17,auVar26);
          break;
        case 4:
          auVar10 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x30);
          uStack_3e10 = auVar11._0_8_;
          uStack_3e08 = auVar11._8_8_;
          uStack_4238 = SUB328(ZEXT832(0),4);
          auVar32._8_8_ = uStack_4ef8;
          auVar32._0_8_ = local_4f00;
          auVar32._16_8_ = uStack_4ef0;
          auVar32._24_8_ = uStack_4ee8;
          auVar17 = vsubps_avx(ZEXT832(uStack_4238) << 0x40,auVar32);
          auVar31._8_8_ = 0x42b0c0a542b0c0a5;
          auVar31._0_8_ = 0x42b0c0a542b0c0a5;
          auVar31._16_8_ = 0x42b0c0a542b0c0a5;
          auVar31._24_8_ = 0x42b0c0a542b0c0a5;
          auVar17 = vminps_avx(auVar17,auVar31);
          auVar30._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar30._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar30._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar30._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar16 = vmaxps_avx(auVar17,auVar30);
          local_2e00 = auVar16._0_4_;
          fStack_2dfc = auVar16._4_4_;
          fStack_2df8 = auVar16._8_4_;
          fStack_2df4 = auVar16._12_4_;
          fStack_2df0 = auVar16._16_4_;
          fStack_2dec = auVar16._20_4_;
          fStack_2de8 = auVar16._24_4_;
          local_3340._4_4_ = fStack_2dfc * 1.442695 + 0.5;
          local_3340._0_4_ = local_2e00 * 1.442695 + 0.5;
          fStack_3338 = fStack_2df8 * 1.442695 + 0.5;
          fStack_3334 = fStack_2df4 * 1.442695 + 0.5;
          fStack_3330 = fStack_2df0 * 1.442695 + 0.5;
          fStack_332c = fStack_2dec * 1.442695 + 0.5;
          fStack_3328 = fStack_2de8 * 1.442695 + 0.5;
          uStack_3324 = 0x3ff8aa3b;
          auVar19 = vroundps_avx(_local_3340,1);
          auVar17 = vcmpps_avx(_local_3340,auVar19,1);
          auVar33._8_8_ = 0x3f8000003f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          auVar33._16_8_ = 0x3f8000003f800000;
          auVar33._24_8_ = 0x3f8000003f800000;
          auVar17 = vandps_avx(auVar17,auVar33);
          auVar17 = vsubps_avx(auVar19,auVar17);
          local_28c0 = auVar17._0_4_;
          fStack_28bc = auVar17._4_4_;
          fStack_28b8 = auVar17._8_4_;
          fStack_28b4 = auVar17._12_4_;
          fStack_28b0 = auVar17._16_4_;
          fStack_28ac = auVar17._20_4_;
          fStack_28a8 = auVar17._24_4_;
          fStack_28a4 = auVar17._28_4_;
          auVar36._4_4_ = fStack_28bc * 0.6933594;
          auVar36._0_4_ = local_28c0 * 0.6933594;
          auVar36._8_4_ = fStack_28b8 * 0.6933594;
          auVar36._12_4_ = fStack_28b4 * 0.6933594;
          auVar36._16_4_ = fStack_28b0 * 0.6933594;
          auVar36._20_4_ = fStack_28ac * 0.6933594;
          auVar36._24_4_ = fStack_28a8 * 0.6933594;
          auVar36._28_4_ = fStack_28a4;
          auVar17 = vsubps_avx(auVar16,auVar36);
          auVar35._4_4_ = fStack_28bc * -0.00021219444;
          auVar35._0_4_ = local_28c0 * -0.00021219444;
          auVar35._8_4_ = fStack_28b8 * -0.00021219444;
          auVar35._12_4_ = fStack_28b4 * -0.00021219444;
          auVar35._16_4_ = fStack_28b0 * -0.00021219444;
          auVar35._20_4_ = fStack_28ac * -0.00021219444;
          auVar35._24_4_ = fStack_28a8 * -0.00021219444;
          auVar35._28_4_ = fStack_28a4;
          auVar17 = vsubps_avx(auVar17,auVar35);
          local_2c00 = auVar17._0_4_;
          fStack_2bfc = auVar17._4_4_;
          fStack_2bf8 = auVar17._8_4_;
          fStack_2bf4 = auVar17._12_4_;
          fStack_2bf0 = auVar17._16_4_;
          fStack_2bec = auVar17._20_4_;
          fStack_2be8 = auVar17._24_4_;
          fStack_2be4 = auVar17._28_4_;
          local_3360 = CONCAT44((int)fStack_28bc,(int)local_28c0);
          uStack_3358 = CONCAT44((int)fStack_28b4,(int)fStack_28b8);
          uStack_3350 = CONCAT44((int)fStack_28ac,(int)fStack_28b0);
          uStack_3348 = CONCAT44((int)fStack_28a4,(int)fStack_28a8);
          auVar42._8_8_ = uStack_3358;
          auVar42._0_8_ = local_3360;
          auVar41._8_8_ = 0x7f0000007f;
          auVar41._0_8_ = 0x7f0000007f;
          auVar12 = vpaddd_avx(auVar42,auVar41);
          auVar40._8_8_ = uStack_3348;
          auVar40._0_8_ = uStack_3350;
          auVar39._8_8_ = 0x7f0000007f;
          auVar39._0_8_ = 0x7f0000007f;
          auVar13 = vpaddd_avx(auVar40,auVar39);
          auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
          auVar13 = vpslld_avx(auVar13,ZEXT416(0x17));
          local_2c60 = auVar12._0_4_;
          fStack_2c5c = auVar12._4_4_;
          fStack_2c58 = auVar12._8_4_;
          fStack_2c54 = auVar12._12_4_;
          fStack_2c50 = auVar13._0_4_;
          fStack_2c4c = auVar13._4_4_;
          fStack_2c48 = auVar13._8_4_;
          local_4200 = auVar10._0_4_;
          fStack_41fc = auVar10._4_4_;
          fStack_41f8 = auVar10._8_4_;
          fStack_41f4 = auVar10._12_4_;
          fStack_41f0 = auVar11._0_4_;
          fStack_41ec = auVar11._4_4_;
          fStack_41e8 = auVar11._8_4_;
          fStack_41e4 = auVar11._12_4_;
          auVar28._16_8_ = uStack_3e10;
          auVar28._0_16_ = auVar10;
          auVar28._24_8_ = uStack_3e08;
          auVar27._4_4_ =
               fStack_41fc +
               ((((((fStack_2bfc * 0.00019875691 + 0.0013981999) * fStack_2bfc + 0.008333452) *
                   fStack_2bfc + 0.041665796) * fStack_2bfc + 0.16666666) * fStack_2bfc + 0.5) *
                fStack_2bfc * fStack_2bfc + fStack_2bfc + 1.0) * fStack_2c5c;
          auVar27._0_4_ =
               local_4200 +
               ((((((local_2c00 * 0.00019875691 + 0.0013981999) * local_2c00 + 0.008333452) *
                   local_2c00 + 0.041665796) * local_2c00 + 0.16666666) * local_2c00 + 0.5) *
                local_2c00 * local_2c00 + local_2c00 + 1.0) * local_2c60;
          auVar27._8_4_ =
               fStack_41f8 +
               ((((((fStack_2bf8 * 0.00019875691 + 0.0013981999) * fStack_2bf8 + 0.008333452) *
                   fStack_2bf8 + 0.041665796) * fStack_2bf8 + 0.16666666) * fStack_2bf8 + 0.5) *
                fStack_2bf8 * fStack_2bf8 + fStack_2bf8 + 1.0) * fStack_2c58;
          auVar27._12_4_ =
               fStack_41f4 +
               ((((((fStack_2bf4 * 0.00019875691 + 0.0013981999) * fStack_2bf4 + 0.008333452) *
                   fStack_2bf4 + 0.041665796) * fStack_2bf4 + 0.16666666) * fStack_2bf4 + 0.5) *
                fStack_2bf4 * fStack_2bf4 + fStack_2bf4 + 1.0) * fStack_2c54;
          auVar27._16_4_ =
               fStack_41f0 +
               ((((((fStack_2bf0 * 0.00019875691 + 0.0013981999) * fStack_2bf0 + 0.008333452) *
                   fStack_2bf0 + 0.041665796) * fStack_2bf0 + 0.16666666) * fStack_2bf0 + 0.5) *
                fStack_2bf0 * fStack_2bf0 + fStack_2bf0 + 1.0) * fStack_2c50;
          auVar27._20_4_ =
               fStack_41ec +
               ((((((fStack_2bec * 0.00019875691 + 0.0013981999) * fStack_2bec + 0.008333452) *
                   fStack_2bec + 0.041665796) * fStack_2bec + 0.16666666) * fStack_2bec + 0.5) *
                fStack_2bec * fStack_2bec + fStack_2bec + 1.0) * fStack_2c4c;
          auVar27._24_4_ =
               fStack_41e8 +
               ((((((fStack_2be8 * 0.00019875691 + 0.0013981999) * fStack_2be8 + 0.008333452) *
                   fStack_2be8 + 0.041665796) * fStack_2be8 + 0.16666666) * fStack_2be8 + 0.5) *
                fStack_2be8 * fStack_2be8 + fStack_2be8 + 1.0) * fStack_2c48;
          auVar27._28_4_ = fStack_41e4 + fStack_2be4 + fStack_2be4 + 1.0;
          _local_4800 = vdivps_avx(auVar28,auVar27);
          break;
        case 5:
          local_3b80._8_8_ = uStack_4ef8;
          local_3b80._0_8_ = local_4f00;
          auVar29._16_8_ = uStack_4ef0;
          auVar29._0_16_ = local_3b80;
          auVar29._24_8_ = uStack_4ee8;
          auVar18._8_8_ = 0x42b0c0a542b0c0a5;
          auVar18._0_8_ = 0x42b0c0a542b0c0a5;
          auVar18._16_8_ = 0x42b0c0a542b0c0a5;
          auVar18._24_8_ = 0x42b0c0a542b0c0a5;
          auVar17 = vminps_avx(auVar29,auVar18);
          auVar19._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar19._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar19._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar16 = vmaxps_avx(auVar17,auVar19);
          local_3680 = auVar16._0_4_;
          fStack_367c = auVar16._4_4_;
          fStack_3678 = auVar16._8_4_;
          fStack_3674 = auVar16._12_4_;
          fStack_3670 = auVar16._16_4_;
          fStack_366c = auVar16._20_4_;
          fStack_3668 = auVar16._24_4_;
          local_3bc0._4_4_ = fStack_367c * 1.442695 + 0.5;
          local_3bc0._0_4_ = local_3680 * 1.442695 + 0.5;
          fStack_3bb8 = fStack_3678 * 1.442695 + 0.5;
          fStack_3bb4 = fStack_3674 * 1.442695 + 0.5;
          fStack_3bb0 = fStack_3670 * 1.442695 + 0.5;
          fStack_3bac = fStack_366c * 1.442695 + 0.5;
          fStack_3ba8 = fStack_3668 * 1.442695 + 0.5;
          uStack_3ba4 = 0x3ff8aa3b;
          auVar19 = vroundps_avx(_local_3bc0,1);
          auVar17 = vcmpps_avx(_local_3bc0,auVar19,1);
          auVar34._8_8_ = 0x3f8000003f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          auVar34._16_8_ = 0x3f8000003f800000;
          auVar34._24_8_ = 0x3f8000003f800000;
          auVar17 = vandps_avx(auVar17,auVar34);
          auVar17 = vsubps_avx(auVar19,auVar17);
          local_2700 = auVar17._0_4_;
          fStack_26fc = auVar17._4_4_;
          fStack_26f8 = auVar17._8_4_;
          fStack_26f4 = auVar17._12_4_;
          fStack_26f0 = auVar17._16_4_;
          fStack_26ec = auVar17._20_4_;
          fStack_26e8 = auVar17._24_4_;
          fStack_26e4 = auVar17._28_4_;
          auVar38._4_4_ = fStack_26fc * 0.6933594;
          auVar38._0_4_ = local_2700 * 0.6933594;
          auVar38._8_4_ = fStack_26f8 * 0.6933594;
          auVar38._12_4_ = fStack_26f4 * 0.6933594;
          auVar38._16_4_ = fStack_26f0 * 0.6933594;
          auVar38._20_4_ = fStack_26ec * 0.6933594;
          auVar38._24_4_ = fStack_26e8 * 0.6933594;
          auVar38._28_4_ = fStack_26e4;
          auVar17 = vsubps_avx(auVar16,auVar38);
          auVar37._4_4_ = fStack_26fc * -0.00021219444;
          auVar37._0_4_ = local_2700 * -0.00021219444;
          auVar37._8_4_ = fStack_26f8 * -0.00021219444;
          auVar37._12_4_ = fStack_26f4 * -0.00021219444;
          auVar37._16_4_ = fStack_26f0 * -0.00021219444;
          auVar37._20_4_ = fStack_26ec * -0.00021219444;
          auVar37._24_4_ = fStack_26e8 * -0.00021219444;
          auVar37._28_4_ = fStack_26e4;
          auVar17 = vsubps_avx(auVar17,auVar37);
          local_3480 = auVar17._0_4_;
          fStack_347c = auVar17._4_4_;
          fStack_3478 = auVar17._8_4_;
          fStack_3474 = auVar17._12_4_;
          fStack_3470 = auVar17._16_4_;
          fStack_346c = auVar17._20_4_;
          fStack_3468 = auVar17._24_4_;
          fStack_3464 = auVar17._28_4_;
          local_3be0 = CONCAT44((int)fStack_26fc,(int)local_2700);
          uStack_3bd8 = CONCAT44((int)fStack_26f4,(int)fStack_26f8);
          uStack_3bd0 = CONCAT44((int)fStack_26ec,(int)fStack_26f0);
          uStack_3bc8 = CONCAT44((int)fStack_26e4,(int)fStack_26e8);
          auVar13._8_8_ = uStack_3bd8;
          auVar13._0_8_ = local_3be0;
          auVar10._8_8_ = 0x7f0000007f;
          auVar10._0_8_ = 0x7f0000007f;
          auVar10 = vpaddd_avx(auVar13,auVar10);
          auVar12._8_8_ = uStack_3bc8;
          auVar12._0_8_ = uStack_3bd0;
          auVar11._8_8_ = 0x7f0000007f;
          auVar11._0_8_ = 0x7f0000007f;
          auVar11 = vpaddd_avx(auVar12,auVar11);
          auVar10 = vpslld_avx(auVar10,ZEXT416(0x17));
          auVar11 = vpslld_avx(auVar11,ZEXT416(0x17));
          local_34e0 = auVar10._0_4_;
          fStack_34dc = auVar10._4_4_;
          fStack_34d8 = auVar10._8_4_;
          fStack_34d4 = auVar10._12_4_;
          fStack_34d0 = auVar11._0_4_;
          fStack_34cc = auVar11._4_4_;
          fStack_34c8 = auVar11._8_4_;
          auVar10 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x30);
          uStack_5238 = SUB328(ZEXT832(0),4);
          local_41a0 = auVar10._0_4_;
          fStack_419c = auVar10._4_4_;
          fStack_4198 = auVar10._8_4_;
          fStack_4194 = auVar10._12_4_;
          fStack_4190 = auVar11._0_4_;
          fStack_418c = auVar11._4_4_;
          fStack_4188 = auVar11._8_4_;
          fStack_4184 = auVar11._12_4_;
          local_1020._4_4_ =
               ((((((fStack_347c * 0.00019875691 + 0.0013981999) * fStack_347c + 0.008333452) *
                   fStack_347c + 0.041665796) * fStack_347c + 0.16666666) * fStack_347c + 0.5) *
                fStack_347c * fStack_347c + fStack_347c + 1.0) * fStack_34dc + fStack_419c;
          local_1020._0_4_ =
               ((((((local_3480 * 0.00019875691 + 0.0013981999) * local_3480 + 0.008333452) *
                   local_3480 + 0.041665796) * local_3480 + 0.16666666) * local_3480 + 0.5) *
                local_3480 * local_3480 + local_3480 + 1.0) * local_34e0 + local_41a0;
          fStack_1018 = ((((((fStack_3478 * 0.00019875691 + 0.0013981999) * fStack_3478 +
                            0.008333452) * fStack_3478 + 0.041665796) * fStack_3478 + 0.16666666) *
                          fStack_3478 + 0.5) * fStack_3478 * fStack_3478 + fStack_3478 + 1.0) *
                        fStack_34d8 + fStack_4198;
          fStack_1014 = ((((((fStack_3474 * 0.00019875691 + 0.0013981999) * fStack_3474 +
                            0.008333452) * fStack_3474 + 0.041665796) * fStack_3474 + 0.16666666) *
                          fStack_3474 + 0.5) * fStack_3474 * fStack_3474 + fStack_3474 + 1.0) *
                        fStack_34d4 + fStack_4194;
          uStack_1010._0_4_ =
               ((((((fStack_3470 * 0.00019875691 + 0.0013981999) * fStack_3470 + 0.008333452) *
                   fStack_3470 + 0.041665796) * fStack_3470 + 0.16666666) * fStack_3470 + 0.5) *
                fStack_3470 * fStack_3470 + fStack_3470 + 1.0) * fStack_34d0 + fStack_4190;
          uStack_1010._4_4_ =
               ((((((fStack_346c * 0.00019875691 + 0.0013981999) * fStack_346c + 0.008333452) *
                   fStack_346c + 0.041665796) * fStack_346c + 0.16666666) * fStack_346c + 0.5) *
                fStack_346c * fStack_346c + fStack_346c + 1.0) * fStack_34cc + fStack_418c;
          uStack_1008._0_4_ =
               ((((((fStack_3468 * 0.00019875691 + 0.0013981999) * fStack_3468 + 0.008333452) *
                   fStack_3468 + 0.041665796) * fStack_3468 + 0.16666666) * fStack_3468 + 0.5) *
                fStack_3468 * fStack_3468 + fStack_3468 + 1.0) * fStack_34c8 + fStack_4188;
          uStack_1008._4_4_ = fStack_3464 + fStack_3464 + 1.0 + fStack_4184;
          auVar17 = _local_1020;
          auVar19 = vcmpps_avx(_local_1020,ZEXT832(uStack_5238) << 0x40,2);
          uStack_1008 = auVar17._24_8_;
          auVar56._16_8_ = uStack_1010;
          auVar56._0_16_ = _local_1020;
          auVar56._24_8_ = uStack_1008;
          auVar55._8_8_ = 0x80000000800000;
          auVar55._0_8_ = 0x80000000800000;
          auVar55._16_8_ = 0x80000000800000;
          auVar55._24_8_ = 0x80000000800000;
          auVar17 = vmaxps_avx(auVar56,auVar55);
          auVar10 = vpsrld_avx(auVar17._0_16_,ZEXT416(0x17));
          auVar11 = vpsrld_avx(auVar17._16_16_,ZEXT416(0x17));
          auVar60._8_8_ = 0x807fffff807fffff;
          auVar60._0_8_ = 0x807fffff807fffff;
          auVar60._16_8_ = 0x807fffff807fffff;
          auVar60._24_8_ = 0x807fffff807fffff;
          auVar17 = vandps_avx(auVar17,auVar60);
          auVar64._8_8_ = 0x3f0000003f000000;
          auVar64._0_8_ = 0x3f0000003f000000;
          auVar64._16_8_ = 0x3f0000003f000000;
          auVar64._24_8_ = 0x3f0000003f000000;
          auVar18 = vorps_avx(auVar17,auVar64);
          auVar67._8_8_ = 0x7f0000007f;
          auVar67._0_8_ = 0x7f0000007f;
          auVar10 = vpsubd_avx(auVar10,auVar67);
          auVar66._8_8_ = 0x7f0000007f;
          auVar66._0_8_ = 0x7f0000007f;
          auVar11 = vpsubd_avx(auVar11,auVar66);
          local_140 = auVar11._0_8_;
          uStack_138 = auVar11._8_8_;
          auVar65._16_8_ = local_140;
          auVar65._0_16_ = auVar10;
          auVar65._24_8_ = uStack_138;
          auVar17 = vcvtdq2ps_avx(auVar65);
          local_900 = auVar17._0_4_;
          fStack_8fc = auVar17._4_4_;
          fStack_8f8 = auVar17._8_4_;
          fStack_8f4 = auVar17._12_4_;
          fStack_8f0 = auVar17._16_4_;
          fStack_8ec = auVar17._20_4_;
          fStack_8e8 = auVar17._24_4_;
          fStack_8e4 = auVar17._28_4_;
          local_10a0._4_4_ = fStack_8fc + 1.0;
          local_10a0._0_4_ = local_900 + 1.0;
          fStack_1098 = fStack_8f8 + 1.0;
          fStack_1094 = fStack_8f4 + 1.0;
          uStack_1090._0_4_ = fStack_8f0 + 1.0;
          uStack_1090._4_4_ = fStack_8ec + 1.0;
          uStack_1088._0_4_ = fStack_8e8 + 1.0;
          uStack_1088._4_4_ = fStack_8e4 + 1.0;
          auVar29 = _local_10a0;
          auVar16 = vcmpps_avx(auVar18,_DAT_01f08d60,1);
          auVar17 = vandps_avx(auVar18,auVar16);
          auVar58._8_8_ = 0x3f8000003f800000;
          auVar58._0_8_ = 0x3f8000003f800000;
          auVar58._16_8_ = 0x3f8000003f800000;
          auVar58._24_8_ = 0x3f8000003f800000;
          auVar18 = vsubps_avx(auVar18,auVar58);
          uStack_1088 = auVar29._24_8_;
          auVar59._8_8_ = 0x3f8000003f800000;
          auVar59._0_8_ = 0x3f8000003f800000;
          auVar59._16_8_ = 0x3f8000003f800000;
          auVar59._24_8_ = 0x3f8000003f800000;
          auVar16 = vandps_avx(auVar59,auVar16);
          auVar57._16_8_ = uStack_1090;
          auVar57._0_16_ = _local_10a0;
          auVar57._24_8_ = uStack_1088;
          auVar16 = vsubps_avx(auVar57,auVar16);
          local_940 = auVar18._0_4_;
          fStack_93c = auVar18._4_4_;
          fStack_938 = auVar18._8_4_;
          fStack_934 = auVar18._12_4_;
          fStack_930 = auVar18._16_4_;
          fStack_92c = auVar18._20_4_;
          fStack_928 = auVar18._24_4_;
          fStack_924 = auVar18._28_4_;
          local_960 = auVar17._0_4_;
          fStack_95c = auVar17._4_4_;
          fStack_958 = auVar17._8_4_;
          fStack_954 = auVar17._12_4_;
          fStack_950 = auVar17._16_4_;
          fStack_94c = auVar17._20_4_;
          fStack_948 = auVar17._24_4_;
          fStack_944 = auVar17._28_4_;
          local_940 = local_940 + local_960;
          fStack_93c = fStack_93c + fStack_95c;
          fStack_938 = fStack_938 + fStack_958;
          fStack_934 = fStack_934 + fStack_954;
          fStack_930 = fStack_930 + fStack_950;
          fStack_92c = fStack_92c + fStack_94c;
          fStack_928 = fStack_928 + fStack_948;
          fStack_924 = fStack_924 + fStack_944;
          local_6c0 = auVar16._0_4_;
          fStack_6bc = auVar16._4_4_;
          fStack_6b8 = auVar16._8_4_;
          fStack_6b4 = auVar16._12_4_;
          fStack_6b0 = auVar16._16_4_;
          fStack_6ac = auVar16._20_4_;
          fStack_6a8 = auVar16._24_4_;
          local_1120._4_4_ =
               fStack_6bc * -0.00021219444 +
               ((((((((fStack_93c * 0.070376836 + -0.1151461) * fStack_93c + 0.116769984) *
                     fStack_93c + -0.12420141) * fStack_93c + 0.14249323) * fStack_93c + -0.16668057
                  ) * fStack_93c + 0.20000714) * fStack_93c + -0.24999994) * fStack_93c + 0.3333333)
               * fStack_93c * fStack_93c * fStack_93c;
          local_1120._0_4_ =
               local_6c0 * -0.00021219444 +
               ((((((((local_940 * 0.070376836 + -0.1151461) * local_940 + 0.116769984) * local_940
                    + -0.12420141) * local_940 + 0.14249323) * local_940 + -0.16668057) * local_940
                 + 0.20000714) * local_940 + -0.24999994) * local_940 + 0.3333333) * local_940 *
               local_940 * local_940;
          fStack_1118 = fStack_6b8 * -0.00021219444 +
                        ((((((((fStack_938 * 0.070376836 + -0.1151461) * fStack_938 + 0.116769984) *
                              fStack_938 + -0.12420141) * fStack_938 + 0.14249323) * fStack_938 +
                           -0.16668057) * fStack_938 + 0.20000714) * fStack_938 + -0.24999994) *
                         fStack_938 + 0.3333333) * fStack_938 * fStack_938 * fStack_938;
          fStack_1114 = fStack_6b4 * -0.00021219444 +
                        ((((((((fStack_934 * 0.070376836 + -0.1151461) * fStack_934 + 0.116769984) *
                              fStack_934 + -0.12420141) * fStack_934 + 0.14249323) * fStack_934 +
                           -0.16668057) * fStack_934 + 0.20000714) * fStack_934 + -0.24999994) *
                         fStack_934 + 0.3333333) * fStack_934 * fStack_934 * fStack_934;
          uStack_1110._0_4_ =
               fStack_6b0 * -0.00021219444 +
               ((((((((fStack_930 * 0.070376836 + -0.1151461) * fStack_930 + 0.116769984) *
                     fStack_930 + -0.12420141) * fStack_930 + 0.14249323) * fStack_930 + -0.16668057
                  ) * fStack_930 + 0.20000714) * fStack_930 + -0.24999994) * fStack_930 + 0.3333333)
               * fStack_930 * fStack_930 * fStack_930;
          uStack_1110._4_4_ =
               fStack_6ac * -0.00021219444 +
               ((((((((fStack_92c * 0.070376836 + -0.1151461) * fStack_92c + 0.116769984) *
                     fStack_92c + -0.12420141) * fStack_92c + 0.14249323) * fStack_92c + -0.16668057
                  ) * fStack_92c + 0.20000714) * fStack_92c + -0.24999994) * fStack_92c + 0.3333333)
               * fStack_92c * fStack_92c * fStack_92c;
          uStack_1108._0_4_ =
               fStack_6a8 * -0.00021219444 +
               ((((((((fStack_928 * 0.070376836 + -0.1151461) * fStack_928 + 0.116769984) *
                     fStack_928 + -0.12420141) * fStack_928 + 0.14249323) * fStack_928 + -0.16668057
                  ) * fStack_928 + 0.20000714) * fStack_928 + -0.24999994) * fStack_928 + 0.3333333)
               * fStack_928 * fStack_928 * fStack_928;
          uStack_1108._4_4_ = fStack_924 + 0.3333333 + -0.00021219444;
          auVar17 = _local_1120;
          uStack_1108 = auVar17._24_8_;
          auVar62._16_8_ = uStack_1110;
          auVar62._0_16_ = _local_1120;
          auVar62._24_8_ = uStack_1108;
          auVar61._4_4_ = fStack_93c * fStack_93c * 0.5;
          auVar61._0_4_ = local_940 * local_940 * 0.5;
          auVar61._8_4_ = fStack_938 * fStack_938 * 0.5;
          auVar61._12_4_ = fStack_934 * fStack_934 * 0.5;
          auVar61._16_4_ = fStack_930 * fStack_930 * 0.5;
          auVar61._20_4_ = fStack_92c * fStack_92c * 0.5;
          auVar61._24_4_ = fStack_928 * fStack_928 * 0.5;
          auVar61._28_4_ = fStack_924;
          auVar17 = vsubps_avx(auVar62,auVar61);
          local_9a0 = auVar17._0_4_;
          fStack_99c = auVar17._4_4_;
          fStack_998 = auVar17._8_4_;
          fStack_994 = auVar17._12_4_;
          fStack_990 = auVar17._16_4_;
          fStack_98c = auVar17._20_4_;
          fStack_988 = auVar17._24_4_;
          fStack_984 = auVar17._28_4_;
          local_1020._4_4_ = fStack_6bc * 0.6933594 + fStack_93c + fStack_99c;
          local_1020._0_4_ = local_6c0 * 0.6933594 + local_940 + local_9a0;
          fStack_1018 = fStack_6b8 * 0.6933594 + fStack_938 + fStack_998;
          fStack_1014 = fStack_6b4 * 0.6933594 + fStack_934 + fStack_994;
          uStack_1010._0_4_ = fStack_6b0 * 0.6933594 + fStack_930 + fStack_990;
          uStack_1010._4_4_ = fStack_6ac * 0.6933594 + fStack_92c + fStack_98c;
          uStack_1008._0_4_ = fStack_6a8 * 0.6933594 + fStack_928 + fStack_988;
          uStack_1008._4_4_ = fStack_924 + fStack_984 + 0.6933594;
          auVar17 = _local_1020;
          uStack_1008 = auVar17._24_8_;
          auVar63._16_8_ = uStack_1010;
          auVar63._0_16_ = _local_1020;
          auVar63._24_8_ = uStack_1008;
          auVar17 = vorps_avx(auVar63,auVar19);
          auVar10 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3f800000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x30);
          uStack_1f90 = auVar11._0_8_;
          uStack_1f88 = auVar11._8_8_;
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x30);
          local_20e0 = auVar17._0_4_;
          fStack_20dc = auVar17._4_4_;
          fStack_20d8 = auVar17._8_4_;
          fStack_20d4 = auVar17._12_4_;
          fStack_20d0 = auVar17._16_4_;
          fStack_20cc = auVar17._20_4_;
          fStack_20c8 = auVar17._24_4_;
          uStack_20c4 = auVar17._28_4_;
          local_2100 = auVar11._0_4_;
          fStack_20fc = auVar11._4_4_;
          fStack_20f8 = auVar11._8_4_;
          fStack_20f4 = auVar11._12_4_;
          fStack_20f0 = auVar12._0_4_;
          fStack_20ec = auVar12._4_4_;
          fStack_20e8 = auVar12._8_4_;
          auVar11 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f800000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f800000),0x30);
          uStack_1fd0 = auVar12._0_8_;
          uStack_1fc8 = auVar12._8_8_;
          auVar47._4_4_ = fStack_20dc * fStack_20fc;
          auVar47._0_4_ = local_20e0 * local_2100;
          auVar47._12_4_ = fStack_20d4 * fStack_20f4;
          auVar47._8_4_ = fStack_20d8 * fStack_20f8;
          auVar47._20_4_ = fStack_20cc * fStack_20ec;
          auVar47._16_4_ = fStack_20d0 * fStack_20f0;
          auVar47._28_4_ = uStack_20c4;
          auVar47._24_4_ = fStack_20c8 * fStack_20e8;
          auVar17 = vsubps_avx(ZEXT832(uStack_5238) << 0x40,auVar47);
          auVar46._8_8_ = 0x42b0c0a542b0c0a5;
          auVar46._0_8_ = 0x42b0c0a542b0c0a5;
          auVar46._16_8_ = 0x42b0c0a542b0c0a5;
          auVar46._24_8_ = 0x42b0c0a542b0c0a5;
          auVar17 = vminps_avx(auVar17,auVar46);
          auVar45._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar45._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar45._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar16 = vmaxps_avx(auVar17,auVar45);
          local_1900 = auVar16._0_4_;
          fStack_18fc = auVar16._4_4_;
          fStack_18f8 = auVar16._8_4_;
          fStack_18f4 = auVar16._12_4_;
          fStack_18f0 = auVar16._16_4_;
          fStack_18ec = auVar16._20_4_;
          fStack_18e8 = auVar16._24_4_;
          local_1e40._4_4_ = fStack_18fc * 1.442695 + 0.5;
          local_1e40._0_4_ = local_1900 * 1.442695 + 0.5;
          fStack_1e38 = fStack_18f8 * 1.442695 + 0.5;
          fStack_1e34 = fStack_18f4 * 1.442695 + 0.5;
          fStack_1e30 = fStack_18f0 * 1.442695 + 0.5;
          fStack_1e2c = fStack_18ec * 1.442695 + 0.5;
          fStack_1e28 = fStack_18e8 * 1.442695 + 0.5;
          uStack_1e24 = 0x3ff8aa3b;
          auVar19 = vroundps_avx(_local_1e40,1);
          auVar17 = vcmpps_avx(_local_1e40,auVar19,1);
          auVar50._8_8_ = 0x3f8000003f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._16_8_ = 0x3f8000003f800000;
          auVar50._24_8_ = 0x3f8000003f800000;
          auVar17 = vandps_avx(auVar17,auVar50);
          auVar17 = vsubps_avx(auVar19,auVar17);
          local_1400 = auVar17._0_4_;
          fStack_13fc = auVar17._4_4_;
          fStack_13f8 = auVar17._8_4_;
          fStack_13f4 = auVar17._12_4_;
          fStack_13f0 = auVar17._16_4_;
          fStack_13ec = auVar17._20_4_;
          fStack_13e8 = auVar17._24_4_;
          fStack_13e4 = auVar17._28_4_;
          auVar52._4_4_ = fStack_13fc * 0.6933594;
          auVar52._0_4_ = local_1400 * 0.6933594;
          auVar52._8_4_ = fStack_13f8 * 0.6933594;
          auVar52._12_4_ = fStack_13f4 * 0.6933594;
          auVar52._16_4_ = fStack_13f0 * 0.6933594;
          auVar52._20_4_ = fStack_13ec * 0.6933594;
          auVar52._24_4_ = fStack_13e8 * 0.6933594;
          auVar52._28_4_ = fStack_13e4;
          auVar17 = vsubps_avx(auVar16,auVar52);
          auVar51._4_4_ = fStack_13fc * -0.00021219444;
          auVar51._0_4_ = local_1400 * -0.00021219444;
          auVar51._8_4_ = fStack_13f8 * -0.00021219444;
          auVar51._12_4_ = fStack_13f4 * -0.00021219444;
          auVar51._16_4_ = fStack_13f0 * -0.00021219444;
          auVar51._20_4_ = fStack_13ec * -0.00021219444;
          auVar51._24_4_ = fStack_13e8 * -0.00021219444;
          auVar51._28_4_ = fStack_13e4;
          auVar17 = vsubps_avx(auVar17,auVar51);
          local_1700 = auVar17._0_4_;
          fStack_16fc = auVar17._4_4_;
          fStack_16f8 = auVar17._8_4_;
          fStack_16f4 = auVar17._12_4_;
          fStack_16f0 = auVar17._16_4_;
          fStack_16ec = auVar17._20_4_;
          fStack_16e8 = auVar17._24_4_;
          fStack_16e4 = auVar17._28_4_;
          local_1e60 = CONCAT44((int)fStack_13fc,(int)local_1400);
          uStack_1e58 = CONCAT44((int)fStack_13f4,(int)fStack_13f8);
          uStack_1e50 = CONCAT44((int)fStack_13ec,(int)fStack_13f0);
          uStack_1e48 = CONCAT44((int)fStack_13e4,(int)fStack_13e8);
          auVar54._8_8_ = uStack_1e58;
          auVar54._0_8_ = local_1e60;
          auVar53._8_8_ = 0x7f0000007f;
          auVar53._0_8_ = 0x7f0000007f;
          auVar13 = vpaddd_avx(auVar54,auVar53);
          auVar15._8_8_ = uStack_1e48;
          auVar15._0_8_ = uStack_1e50;
          auVar14._8_8_ = 0x7f0000007f;
          auVar14._0_8_ = 0x7f0000007f;
          auVar14 = vpaddd_avx(auVar15,auVar14);
          auVar13 = vpslld_avx(auVar13,ZEXT416(0x17));
          auVar14 = vpslld_avx(auVar14,ZEXT416(0x17));
          local_1760 = auVar13._0_4_;
          fStack_175c = auVar13._4_4_;
          fStack_1758 = auVar13._8_4_;
          fStack_1754 = auVar13._12_4_;
          fStack_1750 = auVar14._0_4_;
          fStack_174c = auVar14._4_4_;
          fStack_1748 = auVar14._8_4_;
          local_2020 = auVar11._0_4_;
          fStack_201c = auVar11._4_4_;
          fStack_2018 = auVar11._8_4_;
          fStack_2014 = auVar11._12_4_;
          fStack_2010 = auVar12._0_4_;
          fStack_200c = auVar12._4_4_;
          fStack_2008 = auVar12._8_4_;
          fStack_2004 = auVar12._12_4_;
          auVar44._16_8_ = uStack_1fd0;
          auVar44._0_16_ = auVar11;
          auVar44._24_8_ = uStack_1fc8;
          auVar43._4_4_ =
               fStack_201c +
               (((((fStack_16fc * (fStack_16fc * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16fc + 0.041665796) * fStack_16fc + 0.16666666) * fStack_16fc + 0.5) *
                fStack_16fc * fStack_16fc + fStack_16fc + 1.0) * fStack_175c;
          auVar43._0_4_ =
               local_2020 +
               (((((local_1700 * (local_1700 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   local_1700 + 0.041665796) * local_1700 + 0.16666666) * local_1700 + 0.5) *
                local_1700 * local_1700 + local_1700 + 1.0) * local_1760;
          auVar43._8_4_ =
               fStack_2018 +
               (((((fStack_16f8 * (fStack_16f8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f8 + 0.041665796) * fStack_16f8 + 0.16666666) * fStack_16f8 + 0.5) *
                fStack_16f8 * fStack_16f8 + fStack_16f8 + 1.0) * fStack_1758;
          auVar43._12_4_ =
               fStack_2014 +
               (((((fStack_16f4 * (fStack_16f4 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f4 + 0.041665796) * fStack_16f4 + 0.16666666) * fStack_16f4 + 0.5) *
                fStack_16f4 * fStack_16f4 + fStack_16f4 + 1.0) * fStack_1754;
          auVar43._16_4_ =
               fStack_2010 +
               (((((fStack_16f0 * (fStack_16f0 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16f0 + 0.041665796) * fStack_16f0 + 0.16666666) * fStack_16f0 + 0.5) *
                fStack_16f0 * fStack_16f0 + fStack_16f0 + 1.0) * fStack_1750;
          auVar43._20_4_ =
               fStack_200c +
               (((((fStack_16ec * (fStack_16ec * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16ec + 0.041665796) * fStack_16ec + 0.16666666) * fStack_16ec + 0.5) *
                fStack_16ec * fStack_16ec + fStack_16ec + 1.0) * fStack_174c;
          auVar43._24_4_ =
               fStack_2008 +
               (((((fStack_16e8 * (fStack_16e8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
                   fStack_16e8 + 0.041665796) * fStack_16e8 + 0.16666666) * fStack_16e8 + 0.5) *
                fStack_16e8 * fStack_16e8 + fStack_16e8 + 1.0) * fStack_1748;
          auVar43._28_4_ = fStack_2004 + fStack_16e4 + fStack_16e4 + 1.0;
          auVar17 = vdivps_avx(auVar44,auVar43);
          local_2120 = auVar17._0_4_;
          fStack_211c = auVar17._4_4_;
          fStack_2118 = auVar17._8_4_;
          fStack_2114 = auVar17._12_4_;
          fStack_2110 = auVar17._16_4_;
          fStack_210c = auVar17._20_4_;
          fStack_2108 = auVar17._24_4_;
          auVar49._4_4_ = fStack_211c * fStack_20fc;
          auVar49._0_4_ = local_2120 * local_2100;
          auVar49._8_4_ = fStack_2118 * fStack_20f8;
          auVar49._12_4_ = fStack_2114 * fStack_20f4;
          auVar49._16_4_ = fStack_2110 * fStack_20f0;
          auVar49._20_4_ = fStack_210c * fStack_20ec;
          auVar49._24_4_ = fStack_2108 * fStack_20e8;
          auVar49._28_4_ = auVar17._28_4_;
          auVar48._16_8_ = uStack_1f90;
          auVar48._0_16_ = auVar10;
          auVar48._24_8_ = uStack_1f88;
          auVar17 = vsubps_avx(auVar49,auVar48);
          uStack_4124 = (undefined4)((ulong)uStack_4ee8 >> 0x20);
          local_4160 = auVar17._0_4_;
          fStack_415c = auVar17._4_4_;
          fStack_4158 = auVar17._8_4_;
          fStack_4154 = auVar17._12_4_;
          fStack_4150 = auVar17._16_4_;
          fStack_414c = auVar17._20_4_;
          fStack_4148 = auVar17._24_4_;
          local_4800._4_4_ = fStack_413c * fStack_415c;
          local_4800._0_4_ = local_4140 * local_4160;
          uStack_47f8._0_4_ = fStack_4138 * fStack_4158;
          uStack_47f8._4_4_ = fStack_4134 * fStack_4154;
          uStack_47f0._0_4_ = fStack_4130 * fStack_4150;
          uStack_47f0._4_4_ = fStack_412c * fStack_414c;
          uStack_47e8._0_4_ = fStack_4128 * fStack_4148;
          uStack_47e8._4_4_ = uStack_4124;
          break;
        case 6:
          uVar6 = *(uint *)*plVar20;
          auVar10 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar6),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar6),0x30);
          auVar11 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(uVar6),0x30);
          uVar6 = *(uint *)(*plVar20 + 4);
          auVar12 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar6),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(uVar6),0x30);
          auVar13 = vinsertps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0x10);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar6),0x20);
          auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar6),0x30);
          auVar14 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x20);
          auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3f800000),0x30);
          auVar15 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x20);
          auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3f800000),0x30);
          uStack_3e90 = auVar15._0_8_;
          uStack_3e88 = auVar15._8_8_;
          local_3fc0 = auVar10._0_4_;
          fStack_3fbc = auVar10._4_4_;
          fStack_3fb8 = auVar10._8_4_;
          fStack_3fb4 = auVar10._12_4_;
          fStack_3fb0 = auVar11._0_4_;
          fStack_3fac = auVar11._4_4_;
          fStack_3fa8 = auVar11._8_4_;
          fStack_3fa4 = auVar11._12_4_;
          local_4000 = auVar12._0_4_;
          fStack_3ffc = auVar12._4_4_;
          fStack_3ff8 = auVar12._8_4_;
          fStack_3ff4 = auVar12._12_4_;
          fStack_3ff0 = auVar13._0_4_;
          fStack_3fec = auVar13._4_4_;
          fStack_3fe8 = auVar13._8_4_;
          fStack_3fe4 = auVar13._12_4_;
          local_40e0._4_4_ = fStack_413c * fStack_3fbc + fStack_3ffc;
          local_40e0._0_4_ = local_4140 * local_3fc0 + local_4000;
          fStack_40d8 = fStack_4138 * fStack_3fb8 + fStack_3ff8;
          fStack_40d4 = fStack_4134 * fStack_3fb4 + fStack_3ff4;
          uStack_40d0._0_4_ = fStack_4130 * fStack_3fb0 + fStack_3ff0;
          uStack_40d0._4_4_ = fStack_412c * fStack_3fac + fStack_3fec;
          uStack_40c8._0_4_ = fStack_4128 * fStack_3fa8 + fStack_3fe8;
          uStack_40c8._4_4_ = fStack_3fa4 + fStack_3fe4;
          auVar17 = _local_40e0;
          uStack_40c8 = auVar17._24_8_;
          auVar17._16_8_ = uStack_40d0;
          auVar17._0_16_ = _local_40e0;
          auVar17._24_8_ = uStack_40c8;
          auVar17 = vmaxps_avx(auVar17,ZEXT832(0));
          auVar16._16_8_ = uStack_3e90;
          auVar16._0_16_ = auVar14;
          auVar16._24_8_ = uStack_3e88;
          auVar17 = vminps_avx(auVar17,auVar16);
          local_3f60 = auVar17._0_4_;
          fStack_3f5c = auVar17._4_4_;
          fStack_3f58 = auVar17._8_4_;
          fStack_3f54 = auVar17._12_4_;
          fStack_3f50 = auVar17._16_4_;
          fStack_3f4c = auVar17._20_4_;
          fStack_3f48 = auVar17._24_4_;
          uStack_3f44 = auVar17._28_4_;
          local_4800._4_4_ = fStack_3f5c * fStack_413c;
          local_4800._0_4_ = local_3f60 * local_4140;
          uStack_47f8._0_4_ = fStack_3f58 * fStack_4138;
          uStack_47f8._4_4_ = fStack_3f54 * fStack_4134;
          uStack_47f0._0_4_ = fStack_3f50 * fStack_4130;
          uStack_47f0._4_4_ = fStack_3f4c * fStack_412c;
          uStack_47e8._0_4_ = fStack_3f48 * fStack_4128;
          uStack_47e8._4_4_ = uStack_3f44;
          break;
        default:
          uStack_47f8 = uStack_4ef8;
          local_4800 = (undefined1  [8])local_4f00;
          uStack_47f0 = uStack_4ef0;
          uStack_47e8 = uStack_4ee8;
        }
        *local_4e58 = _local_4800;
        local_4e58 = local_4e58 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack4to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 4;

                            int k = (y * kernel_w + x) * 32;

                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _w0 = _mm256_load_ps(kptr + k);
                            __m256 _w1 = _mm256_load_ps(kptr + k + 8);
                            __m256 _w2 = _mm256_load_ps(kptr + k + 16);
                            __m256 _w3 = _mm256_load_ps(kptr + k + 24);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);
                        }
                    }

                    kptr += maxk * 32;
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_storeu_ps(outptr, _sum);
                outptr += 8;
            }
        }
    }
}